

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O2

void DoNotOptimizeAway<lcp_experiment&>(lcp_experiment *x)

{
  int iVar1;
  lcp_experiment *p;
  
  if (DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid == '\0') {
    iVar1 = __cxa_guard_acquire(&DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid);
    if (iVar1 != 0) {
      DoNotOptimizeAway<lcp_experiment_&>::ttid._M_thread = pthread_self();
      __cxa_guard_release(&DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid);
    }
  }
  if (DoNotOptimizeAway<lcp_experiment_&>::ttid._M_thread != 0) {
    return;
  }
  putchar((int)*(char *)&x->text);
  abort();
}

Assistant:

void DoNotOptimizeAway(T&& x) { // copied from https://github.com/DigitalInBlue/Celero/
  static auto ttid = std::this_thread::get_id();
  if(ttid == std::thread::id()) {
    const auto* p = &x;
    putchar(*reinterpret_cast<const char*>(p));
    std::abort();
  }
}